

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O2

void __thiscall QtMWidgets::PageControl::setCurrentIndex(PageControl *this,int index)

{
  int _t2;
  PageControlPrivate *pPVar1;
  
  pPVar1 = (this->d).d;
  _t2 = pPVar1->currentIndex;
  if ((-1 < index && _t2 != index) && (index < pPVar1->count)) {
    pPVar1->currentIndex = index;
    currentChanged(this,index,_t2);
    QWidget::update();
    return;
  }
  return;
}

Assistant:

void
PageControl::setCurrentIndex( int index )
{
	if( d->currentIndex != index && index >= 0 && index < d->count )
	{
		const int prev = d->currentIndex;

		d->currentIndex = index;

		emit currentChanged( d->currentIndex, prev );

		update();
	}
}